

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_node_same_normal(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  ulong uVar5;
  REF_INT cell;
  REF_STATUS ref_private_macro_code_rss;
  bool bVar6;
  REF_DBL normal [3];
  REF_DBL first_normal [3];
  REF_INT nodes [27];
  double local_e8;
  double local_e0;
  double dStack_d8;
  double local_c8;
  double local_c0;
  double dStack_b8;
  REF_BOOL *local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *allowed = 1;
  pRVar2 = ref_cell->ref_adj;
  uVar5 = 0xffffffff;
  if (node < pRVar2->nnode) {
    uVar5 = (ulong)(uint)pRVar2->first[(uint)node];
  }
  if ((int)uVar5 != -1) {
    cell = pRVar2->item[(int)uVar5].ref;
    bVar6 = false;
    local_b0 = allowed;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x3e2,"ref_smooth_node_same_normal",(ulong)uVar4,"nodes");
        return uVar4;
      }
      uVar4 = ref_node_tri_normal(ref_node,local_a8,&local_e8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x3e3,"ref_smooth_node_same_normal",(ulong)uVar4,"orig normal");
        return uVar4;
      }
      if (!bVar6) {
        local_c8 = local_e8;
        local_c0 = local_e0;
        dStack_b8 = dStack_d8;
        uVar4 = ref_math_normalize(&local_c8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x3e9,"ref_smooth_node_same_normal",(ulong)uVar4,"original triangle has zero area")
          ;
          return uVar4;
        }
      }
      uVar4 = ref_math_normalize(&local_e8);
      if (uVar4 == 4) {
LAB_00206ed7:
        *local_b0 = 0;
        return 0;
      }
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x3f0,"ref_smooth_node_same_normal",(ulong)uVar4,"new normal length");
        return uVar4;
      }
      if (dStack_b8 * dStack_d8 + local_c8 * local_e8 + local_c0 * local_e0 <
          ref_node->same_normal_tol) goto LAB_00206ed7;
      pRVar3 = ref_cell->ref_adj->item;
      iVar1 = pRVar3[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar3[uVar5].ref;
      }
      bVar6 = true;
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_node_same_normal(REF_GRID ref_grid,
                                                      REF_INT node,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normal[3], first_normal[3];
  REF_DBL dot;
  REF_STATUS status;
  REF_BOOL first_tri;

  *allowed = REF_TRUE;

  first_tri = REF_TRUE;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal), "orig normal");
    if (first_tri) {
      first_tri = REF_FALSE;
      first_normal[0] = normal[0];
      first_normal[1] = normal[1];
      first_normal[2] = normal[2];
      RSS(ref_math_normalize(first_normal), "original triangle has zero area");
    }
    status = ref_math_normalize(normal);
    if (REF_DIV_ZERO == status) { /* new triangle face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(status, "new normal length");
    dot = ref_math_dot(first_normal, normal);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}